

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O3

double __thiscall Div::calculate(Div *this)

{
  undefined8 *puVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  
  (**((this->super_BinaryOperator).right)->_vptr_Expression)();
  if ((extraout_XMM0_Qa == 0.0) && (!NAN(extraout_XMM0_Qa))) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = "division by zero";
    __cxa_throw(puVar1,&char_const*::typeinfo,0);
  }
  (**((this->super_BinaryOperator).left)->_vptr_Expression)();
  (**((this->super_BinaryOperator).right)->_vptr_Expression)();
  return extraout_XMM0_Qa_00 / extraout_XMM0_Qa_01;
}

Assistant:

double Div::calculate() {
  if (this->right->calculate() == 0)
    throw ("division by zero");
  return this->left->calculate() / this->right->calculate();
}